

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[22],int&,char_const(&)[6],CylHead&>
          (exception *this,char (*args) [22],int *args_1,char (*args_2) [6],CylHead *args_3)

{
  CylHead *in_R9;
  string local_50;
  CylHead *local_30;
  CylHead *args_local_3;
  char (*args_local_2) [6];
  int *args_local_1;
  char (*args_local) [22];
  exception *this_local;
  
  local_30 = args_3;
  args_local_3 = (CylHead *)args_2;
  args_local_2 = (char (*) [6])args_1;
  args_local_1 = (int *)args;
  args_local = (char (*) [22])this;
  make_string<char_const(&)[22],int&,char_const(&)[6],CylHead&>
            (&local_50,(util *)args,(char (*) [22])args_1,(int *)args_2,(char (*) [6])args_3,in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}